

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

long jas_stream_length(jas_stream_t *stream)

{
  long lVar1;
  long lVar2;
  long pos;
  long oldpos;
  jas_stream_t *stream_local;
  
  lVar1 = jas_stream_tell(stream);
  if (lVar1 < 0) {
    stream_local = (jas_stream_t *)0xffffffffffffffff;
  }
  else {
    lVar2 = jas_stream_seek(stream,0,2);
    if (lVar2 < 0) {
      stream_local = (jas_stream_t *)0xffffffffffffffff;
    }
    else {
      stream_local = (jas_stream_t *)jas_stream_tell(stream);
      if ((long)stream_local < 0) {
        stream_local = (jas_stream_t *)0xffffffffffffffff;
      }
      else {
        lVar1 = jas_stream_seek(stream,lVar1,0);
        if (lVar1 < 0) {
          stream_local = (jas_stream_t *)0xffffffffffffffff;
        }
      }
    }
  }
  return (long)stream_local;
}

Assistant:

long jas_stream_length(jas_stream_t *stream)
{
	long oldpos;
	long pos;
	if ((oldpos = jas_stream_tell(stream)) < 0) {
		return -1;
	}
	if (jas_stream_seek(stream, 0, SEEK_END) < 0) {
		return -1;
	}
	if ((pos = jas_stream_tell(stream)) < 0) {
		return -1;
	}
	if (jas_stream_seek(stream, oldpos, SEEK_SET) < 0) {
		return -1;
	}
	return pos;
}